

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_RESTORE_STAT(effect_handler_context_t_conflict *context)

{
  wchar_t stat_00;
  char *pcVar1;
  wchar_t stat;
  effect_handler_context_t_conflict *context_local;
  
  stat_00 = context->subtype;
  context->ident = true;
  if ((stat_00 < L'\0') || (L'\x04' < stat_00)) {
    context_local._7_1_ = false;
  }
  else if (player->stat_cur[stat_00] == player->stat_max[stat_00]) {
    context_local._7_1_ = true;
  }
  else {
    player->stat_cur[stat_00] = player->stat_max[stat_00];
    player->upkeep->update = player->upkeep->update | 1;
    update_stuff(player);
    pcVar1 = desc_stat(stat_00,false);
    msg("You feel less %s.",pcVar1);
    context_local._7_1_ = true;
  }
  return context_local._7_1_;
}

Assistant:

bool effect_handler_RESTORE_STAT(effect_handler_context_t *context)
{
	int stat = context->subtype;

	/* ID */
	context->ident = true;

	/* Check bounds */
	if (stat < 0 || stat >= STAT_MAX) return false;

	/* Not needed */
	if (player->stat_cur[stat] == player->stat_max[stat])
		return true;

	/* Restore */
	player->stat_cur[stat] = player->stat_max[stat];

	/* Recalculate bonuses */
	player->upkeep->update |= (PU_BONUS);
	update_stuff(player);

	/* Message */
	msg("You feel less %s.", desc_stat(stat, false));

	return (true);
}